

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::DielectricInterfaceBxDF::f
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  TrowbridgeReitzDistribution *this_00;
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  byte bVar8;
  undefined8 uVar9;
  int iVar10;
  long in_FS_OFFSET;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  Float FVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  float fVar34;
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  SampledSpectrum SVar47;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [4];
  undefined1 auStack_94 [8];
  float fStack_8c;
  undefined1 local_88 [16];
  float local_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  undefined1 local_38 [16];
  
  auVar33._4_60_ = wi._12_60_;
  auVar33._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar31._8_56_ = wi._8_56_;
  auVar31._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar29._4_60_ = wo._12_60_;
  auVar29._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._8_56_ = wo._8_56_;
  auVar27._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  _local_48 = auVar27._0_16_;
  local_b8._0_8_ = vmovlps_avx(_local_48);
  auVar24 = auVar31._0_16_;
  local_c8._0_8_ = vmovlps_avx(auVar24);
  local_a8 = auVar33._0_16_;
  auVar15._0_12_ = ZEXT812(0);
  auVar15._12_4_ = 0;
  fVar21 = (this->mfDistrib).alpha_x;
  fVar36 = (this->mfDistrib).alpha_y;
  local_88._0_8_ = 0;
  auVar18._0_8_ = local_88._0_8_;
  local_88._0_8_ = 0;
  auVar25 = vminss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar21));
  uVar9 = 0;
  if (0.001 <= auVar25._0_4_) {
    this_00 = &this->mfDistrib;
    local_38._0_4_ = auVar29._0_4_ * auVar33._0_4_;
    auVar25 = auVar29._0_16_;
    local_c8.z = auVar33._0_4_;
    local_b8.z = auVar29._0_4_;
    if (auVar29._0_4_ * auVar33._0_4_ <= 0.0) {
      if (((auVar29._0_4_ != 0.0) || (uVar9 = auVar18._0_8_, NAN(auVar29._0_4_))) &&
         ((auVar33._0_4_ != 0.0 || (uVar9 = auVar18._0_8_, NAN(auVar33._0_4_))))) {
        local_58 = ZEXT416((uint)this->eta);
        _local_98 = auVar24;
        local_68 = auVar25;
        local_88._0_8_ = 0;
        if (f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') {
          local_88 = auVar15;
          iVar10 = __cxa_guard_acquire(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                        ::reg);
          if (iVar10 != 0) {
            StatRegisterer::StatRegisterer
                      ((StatRegisterer *)
                       &f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg,
                       f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                       StatsAccumulator__,(PixelAccumFunc)0x0);
            __cxa_guard_release(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                                 reg);
          }
        }
        auVar18._0_8_ = vcmpss_avx512f(local_68,ZEXT416(0),0xe);
        bVar2 = (bool)((byte)auVar18._0_8_ & 1);
        *(long *)(in_FS_OFFSET + -0xe0) = *(long *)(in_FS_OFFSET + -0xe0) + 1;
        fVar34 = (float)((uint)bVar2 * local_58._0_4_ +
                        (uint)!bVar2 * (int)(1.0 / (float)local_58._0_4_));
        auVar13._0_4_ = fVar34 * (float)local_98 + (float)local_48._0_4_;
        auVar13._4_4_ = fVar34 * (float)auStack_94._0_4_ + (float)local_48._4_4_;
        auVar13._8_4_ = fVar34 * (float)auStack_94._4_4_ + fStack_40;
        auVar13._12_4_ = fVar34 * fStack_8c + fStack_3c;
        fVar21 = fVar34 * (float)local_a8._0_4_ + local_68._0_4_;
        auVar24._0_4_ = auVar13._0_4_ * auVar13._0_4_;
        auVar24._4_4_ = auVar13._4_4_ * auVar13._4_4_;
        auVar24._8_4_ = auVar13._8_4_ * auVar13._8_4_;
        auVar24._12_4_ = auVar13._12_4_ * auVar13._12_4_;
        auVar25 = vhaddps_avx(auVar24,auVar24);
        fVar36 = fVar21 * fVar21 + auVar25._0_4_;
        auVar25._12_4_ = 0;
        auVar25._0_12_ = ZEXT812(0);
        auVar25 = auVar25 << 0x20;
        if ((fVar36 != 0.0) || (NAN(fVar36))) {
          auVar18 = vsqrtss_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
          auVar28._0_4_ = auVar18._0_4_;
          fVar21 = fVar21 / auVar28._0_4_;
          auVar28._4_4_ = auVar28._0_4_;
          auVar28._8_4_ = auVar28._0_4_;
          auVar28._12_4_ = auVar28._0_4_;
          auVar18 = vdivps_avx(auVar13,auVar28);
          auVar24 = vmovshdup_avx(auVar18);
          auVar24 = vfmadd213ss_fma(auVar24,auVar25,ZEXT416((uint)fVar21));
          auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ + (fVar21 - fVar21))),auVar18,
                                    auVar25);
          auVar16 = auVar18;
          if (auVar24._0_4_ < 0.0) {
            auVar16._0_8_ = auVar18._0_8_ ^ 0x8000000080000000;
            auVar16._8_4_ = auVar18._8_4_ ^ 0x80000000;
            auVar16._12_4_ = auVar18._12_4_ ^ 0x80000000;
          }
          auVar18._0_8_ = vcmpss_avx512f(auVar24,auVar25,1);
          bVar2 = (bool)((byte)auVar18._0_8_ & 1);
          _local_98 = vmovshdup_avx(auVar16);
          fVar36 = local_98;
          fVar21 = (float)((uint)bVar2 * (int)-fVar21 + (uint)!bVar2 * (int)fVar21);
          local_a8 = ZEXT416((uint)fVar21);
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * local_c8.y)),auVar16,
                                    ZEXT416((uint)local_c8.x));
          auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * local_b8.y)),auVar16,
                                    ZEXT416((uint)local_b8.x));
          auVar25 = vfmadd231ss_fma(auVar25,local_a8,ZEXT416((uint)local_c8.z));
          auVar24 = vfmadd231ss_fma(auVar18,local_a8,ZEXT416((uint)local_b8.z));
          auVar18._0_8_ = 0;
          if (0.0 < auVar25._0_4_ * auVar24._0_4_) goto LAB_00408d8e;
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar13 = vandps_avx512vl(auVar24,auVar5);
          auVar28 = SUB6416(ZEXT464(0x3f800000),0);
          auVar15 = vminss_avx(auVar28,auVar24);
          fVar12 = 0.0;
          auVar18._0_8_ = vcmpss_avx512f(auVar28,auVar24,1);
          bVar2 = (bool)((byte)auVar18._0_8_ & 1);
          auVar14._4_12_ = auVar13._4_12_;
          bVar6 = auVar24._0_4_ < -1.0;
          fVar11 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar15._0_4_);
          bVar7 = 0.0 < fVar11;
          auVar14._0_4_ =
               (uint)bVar7 * (int)fVar11 +
               (uint)!bVar7 *
               ((uint)bVar6 * 0x3f800000 +
               (uint)!bVar6 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * auVar13._0_4_));
          fVar11 = (float)((uint)bVar7 * (int)this->eta + (uint)!bVar7 * (int)(1.0 / this->eta));
          auVar15 = ZEXT416((uint)fVar11);
          auVar18 = vfnmadd213ss_fma(auVar14,auVar14,auVar28);
          auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x40);
          auVar18 = vsqrtss_avx(auVar18,auVar18);
          auVar43._0_4_ = auVar18._0_4_ / fVar11;
          auVar43._4_12_ = auVar18._4_12_;
          fVar11 = 1.0;
          if (auVar43._0_4_ < 1.0) {
            auVar18 = vfnmadd213ss_fma(auVar43,auVar43,ZEXT416(0x3f800000));
            auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x20);
            auVar18 = vsqrtss_avx(auVar18,auVar18);
            auVar28 = vfmsub213ss_fma(auVar14,auVar15,auVar18);
            auVar13 = vfmadd213ss_fma(auVar14,auVar15,auVar18);
            auVar44._0_4_ = auVar28._0_4_ / auVar13._0_4_;
            auVar44._4_12_ = auVar28._4_12_;
            auVar13 = vfnmadd213ss_fma(auVar18,auVar15,auVar14);
            auVar18 = vfmadd213ss_fma(auVar18,auVar15,auVar14);
            fVar11 = auVar13._0_4_ / auVar18._0_4_;
            auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar44,auVar44);
            fVar11 = auVar18._0_4_ * 0.5;
          }
          auVar25 = vfmadd213ss_fma(auVar25,ZEXT416((uint)fVar34),auVar24);
          local_68._0_4_ = auVar25._0_4_;
          local_48._0_4_ =
               (float)((uint)(mode == Radiance) * (int)((1.0 / fVar34) * (1.0 / fVar34)) +
                      (uint)(mode != Radiance) * 0x3f800000) * (1.0 - fVar11);
          fVar21 = fVar21 * fVar21;
          auVar25 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar21)),ZEXT816(0) << 0x40);
          fVar34 = auVar25._0_4_ / fVar21;
          if ((ABS(fVar34) != INFINITY) && (1e-16 <= fVar21 * fVar21)) {
            auVar25 = vsqrtss_avx(auVar25,auVar25);
            fVar11 = 0.0;
            fVar12 = auVar25._0_4_;
            if ((fVar12 != 0.0) || (NAN(fVar12))) {
              auVar32._0_4_ = auVar16._0_4_ / fVar12;
              auVar32._4_12_ = auVar16._4_12_;
              auVar25 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar32);
              auVar18._0_8_ = vcmpss_avx512f(auVar32,SUB6416(ZEXT464(0xbf800000),0),1);
              bVar2 = (bool)((byte)auVar18._0_8_ & 1);
              fVar19 = this_00->alpha_x;
              fVar11 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar25._0_4_);
              fVar37 = (fVar11 * fVar11) / (fVar19 * fVar19);
              auVar42._0_4_ = fVar36 / fVar12;
              auVar42._4_12_ = local_98._4_12_;
              auVar25 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar42);
              auVar18._0_8_ = vcmpss_avx512f(auVar42,SUB6416(ZEXT464(0xbf800000),0),1);
              bVar2 = (bool)((byte)auVar18._0_8_ & 1);
              fVar11 = (float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar25._0_4_);
            }
            else {
              fVar19 = this_00->alpha_x;
              fVar37 = 1.0 / (fVar19 * fVar19);
            }
            fVar36 = (this->mfDistrib).alpha_y;
            fVar34 = fVar34 * (fVar37 + (fVar11 * fVar11) / (fVar36 * fVar36)) + 1.0;
            fVar12 = 1.0 / (fVar21 * fVar21 * fVar19 * 3.1415927 * fVar36 * fVar34 * fVar34);
          }
          local_58._0_4_ = fVar12;
          local_88 = auVar16;
          local_6c = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_b8);
          FVar20 = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_c8);
          auVar30._8_4_ = 0x7fffffff;
          auVar30._0_8_ = 0x7fffffff7fffffff;
          auVar30._12_4_ = 0x7fffffff;
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98 * local_c8.y)),local_88,
                                    ZEXT416((uint)local_c8.x));
          auVar25 = vfmadd231ss_fma(auVar25,local_a8,ZEXT416((uint)local_c8.z));
          auVar25 = vandps_avx(auVar25,auVar30);
          auVar18 = vfmadd231ss_fma(ZEXT416((uint)((float)local_98 * local_b8.y)),local_88,
                                    ZEXT416((uint)local_b8.x));
          auVar18 = vfmadd231ss_fma(auVar18,local_a8,ZEXT416((uint)local_b8.z));
          auVar18 = vandps_avx(auVar18,auVar30);
          auVar26._0_4_ =
               ((1.0 / (local_6c + 1.0 + FVar20)) * (float)local_58._0_4_ * auVar25._0_4_ *
               auVar18._0_4_) /
               ((float)local_68._0_4_ * (float)local_68._0_4_ * (float)local_38._0_4_);
          auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar25 = vandps_avx(auVar26,auVar30);
          fVar21 = auVar25._0_4_ * (float)local_48._0_4_;
          goto LAB_00409518;
        }
        *(long *)(in_FS_OFFSET + -0xe8) = *(long *)(in_FS_OFFSET + -0xe8) + 1;
        uVar9 = local_88._0_8_;
      }
    }
    else if (((auVar29._0_4_ != 0.0) || (NAN(auVar29._0_4_))) &&
            ((auVar33._0_4_ != 0.0 || (uVar9 = auVar18._0_8_, NAN(auVar33._0_4_))))) {
      local_98 = (undefined1  [4])wi.super_Tuple3<pbrt::Vector3,_float>.x;
      auStack_94._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.y;
      auStack_94._4_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
      fStack_8c = wi._12_4_;
      auVar35._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.x + (float)local_98;
      auVar35._4_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.y + (float)auStack_94._0_4_;
      auVar35._8_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z + (float)auStack_94._4_4_;
      auVar35._12_4_ = wo._12_4_ + fStack_8c;
      fVar34 = auVar29._0_4_ + auVar33._0_4_;
      if ((auVar35._0_4_ == 0.0) && (auVar18 = vmovshdup_avx(auVar35), auVar18._0_4_ == 0.0)) {
        auVar18._0_8_ = 0;
        if ((fVar34 == 0.0) && (!NAN(fVar34))) goto LAB_00408d8e;
      }
      auVar22._0_4_ = auVar35._0_4_ * auVar35._0_4_;
      auVar22._4_4_ = auVar35._4_4_ * auVar35._4_4_;
      auVar22._8_4_ = auVar35._8_4_ * auVar35._8_4_;
      auVar22._12_4_ = auVar35._12_4_ * auVar35._12_4_;
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar18 = vhaddps_avx(auVar22,auVar22);
      auVar18 = ZEXT416((uint)(fVar34 * fVar34 + auVar18._0_4_));
      auVar18 = vsqrtss_avx(auVar18,auVar18);
      fVar11 = auVar18._0_4_;
      auVar23._4_4_ = fVar11;
      auVar23._0_4_ = fVar11;
      auVar23._8_4_ = fVar11;
      auVar23._12_4_ = fVar11;
      auVar15 = vdivps_avx(auVar35,auVar23);
      fVar34 = fVar34 / fVar11;
      auVar13 = ZEXT816(0) << 0x20;
      auVar18 = vmovshdup_avx(auVar15);
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar18._0_4_ * 0.0)),auVar15,auVar13);
      fVar11 = fVar34 + auVar18._0_4_;
      auVar45 = auVar15;
      if (fVar11 < 0.0) {
        auVar45._0_8_ = auVar15._0_8_ ^ 0x8000000080000000;
        auVar45._8_4_ = auVar15._8_4_ ^ 0x80000000;
        auVar45._12_4_ = auVar15._12_4_ ^ 0x80000000;
      }
      auVar18._0_8_ = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar13,1);
      bVar2 = (bool)((byte)auVar18._0_8_ & 1);
      local_88 = vandps_avx(auVar25,auVar38);
      local_38 = vandps_avx(local_a8,auVar38);
      auVar39._0_4_ = auVar45._0_4_ * (float)local_98;
      auVar39._4_4_ = auVar45._4_4_ * (float)auStack_94._0_4_;
      auVar39._8_4_ = auVar45._8_4_ * (float)auStack_94._4_4_;
      auVar39._12_4_ = auVar45._12_4_ * fStack_8c;
      auVar25 = vmovshdup_avx(auVar39);
      auVar25 = vfmadd231ss_fma(auVar25,auVar45,auVar24);
      auVar24 = vfmadd231ss_fma(auVar25,local_a8,
                                ZEXT416((uint)bVar2 * (int)-fVar34 + (uint)!bVar2 * (int)fVar34));
      auVar3._8_4_ = 0x7fffffff;
      auVar3._0_8_ = 0x7fffffff7fffffff;
      auVar3._12_4_ = 0x7fffffff;
      auVar16 = vandps_avx512vl(auVar24,auVar3);
      auVar28 = SUB6416(ZEXT464(0x3f800000),0);
      local_98 = (undefined1  [4])0x3f800000;
      auVar25 = vminss_avx(auVar28,auVar24);
      auVar18._0_8_ = vcmpss_avx512f(auVar28,auVar24,1);
      bVar2 = (bool)((byte)auVar18._0_8_ & 1);
      auVar17._4_12_ = auVar16._4_12_;
      bVar6 = auVar24._0_4_ < -1.0;
      fVar11 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar25._0_4_);
      bVar7 = 0.0 < fVar11;
      auVar17._0_4_ =
           (uint)bVar7 * (int)fVar11 +
           (uint)!bVar7 *
           ((uint)bVar6 * 0x3f800000 +
           (uint)!bVar6 * ((uint)bVar2 * 0x3f800000 + (uint)!bVar2 * auVar16._0_4_));
      fVar11 = (float)((uint)bVar7 * (int)this->eta + (uint)!bVar7 * (int)(1.0 / this->eta));
      auVar18 = ZEXT416((uint)fVar11);
      auVar25 = vfnmadd213ss_fma(auVar17,auVar17,auVar28);
      auVar25 = vmaxss_avx(auVar25,auVar13);
      auVar25 = vsqrtss_avx(auVar25,auVar25);
      auVar40._0_4_ = auVar25._0_4_ / fVar11;
      auVar40._4_12_ = auVar25._4_12_;
      if (auVar40._0_4_ < 1.0) {
        auVar25 = vfnmadd213ss_fma(auVar40,auVar40,ZEXT416(0x3f800000));
        auVar25 = vmaxss_avx(auVar25,ZEXT816(0) << 0x20);
        auVar25 = vsqrtss_avx(auVar25,auVar25);
        auVar13 = vfmsub213ss_fma(auVar17,auVar18,auVar25);
        auVar24 = vfmadd213ss_fma(auVar17,auVar18,auVar25);
        auVar46._0_4_ = auVar13._0_4_ / auVar24._0_4_;
        auVar46._4_12_ = auVar13._4_12_;
        auVar24 = vfnmadd213ss_fma(auVar25,auVar18,auVar17);
        auVar25 = vfmadd213ss_fma(auVar25,auVar18,auVar17);
        fVar11 = auVar24._0_4_ / auVar25._0_4_;
        auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar46,auVar46);
        local_98 = (undefined1  [4])(auVar25._0_4_ * 0.5);
      }
      fVar34 = fVar34 * fVar34;
      local_a8._0_4_ = 0.0;
      _auStack_94 = auVar31._4_12_;
      auVar25 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar34)),ZEXT816(0) << 0x20);
      fVar11 = auVar25._0_4_ / fVar34;
      if ((ABS(fVar11) != INFINITY) && (1e-16 <= fVar34 * fVar34)) {
        auVar25 = vsqrtss_avx(auVar25,auVar25);
        fVar12 = 0.0;
        fVar19 = auVar25._0_4_;
        if ((fVar19 != 0.0) || (NAN(fVar19))) {
          auVar41._4_4_ = fVar19;
          auVar41._0_4_ = fVar19;
          auVar41._8_4_ = fVar19;
          auVar41._12_4_ = fVar19;
          auVar25 = vdivps_avx(auVar15,auVar41);
          auVar4._8_4_ = 0x3f800000;
          auVar4._0_8_ = 0x3f8000003f800000;
          auVar4._12_4_ = 0x3f800000;
          uVar1 = vcmpps_avx512vl(auVar25,auVar4,0xe);
          auVar18._0_8_ = vcmpss_avx512f(auVar25,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar2 = (bool)((byte)auVar18._0_8_ & 1);
          auVar24 = vmovshdup_avx(auVar25);
          bVar8 = (byte)(uVar1 >> 1);
          fVar12 = (float)((uint)bVar2 * -0x40800000 +
                          (uint)!bVar2 *
                          ((uint)((byte)uVar1 & 1) * 0x3f800000 +
                          (uint)!(bool)((byte)uVar1 & 1) * auVar25._0_4_));
          auVar18._0_8_ = vcmpss_avx512f(auVar24,SUB6416(ZEXT464(0xbf800000),0),1);
          bVar2 = (bool)((byte)auVar18._0_8_ & 1);
          fVar19 = (fVar12 * fVar12) / (fVar21 * fVar21);
          fVar12 = (float)((uint)bVar2 * -0x40800000 +
                          (uint)!bVar2 *
                          ((uint)(bVar8 & 1) * 0x3f800000 + (uint)!(bool)(bVar8 & 1) * auVar24._0_4_
                          ));
        }
        else {
          fVar19 = 1.0 / (fVar21 * fVar21);
        }
        fVar11 = fVar11 * (fVar19 + (fVar12 * fVar12) / (fVar36 * fVar36)) + 1.0;
        local_a8._0_4_ = 1.0 / (fVar36 * fVar21 * 3.1415927 * fVar34 * fVar34 * fVar11 * fVar11);
      }
      local_a8._4_12_ = wi._12_12_;
      local_68._0_4_ = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_b8);
      FVar20 = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_c8);
      fVar21 = ((1.0 / ((float)local_68._0_4_ + 1.0 + FVar20)) * (float)local_a8._0_4_ *
               (float)local_98) / ((float)local_38._0_4_ * 4.0 * (float)local_88._0_4_);
LAB_00409518:
      auVar18._0_8_ =
           CONCAT44(fVar21 * (this->tint).values.values[1],fVar21 * (this->tint).values.values[0]);
      auVar18._8_4_ = fVar21 * (this->tint).values.values[2];
      auVar18._12_4_ = fVar21 * (this->tint).values.values[3];
      auVar25 = vshufpd_avx(auVar18,auVar18,1);
      local_88._0_8_ = auVar25._0_8_;
      goto LAB_00408d8e;
    }
  }
  local_88._0_8_ = uVar9;
  auVar18._0_8_ = 0;
LAB_00408d8e:
  SVar47.values.values[2] = (float)local_88._0_4_;
  SVar47.values.values[3] = (float)local_88._4_4_;
  SVar47.values.values[0] = (float)(int)auVar18._0_8_;
  SVar47.values.values[1] = (float)(int)((ulong)auVar18._0_8_ >> 0x20);
  return (SampledSpectrum)SVar47.values.values;
}

Assistant:

SampledSpectrum DielectricInterfaceBxDF::f(Vector3f wo, Vector3f wi,
                                           TransportMode mode) const {
    if (mfDistrib.EffectivelySmooth())
        return SampledSpectrum(0);
    if (SameHemisphere(wo, wi)) {
        // Compute reflection at non-delta dielectric interface
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        Vector3f wh = wi + wo;
        // Handle degenerate cases for microfacet reflection
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return SampledSpectrum(0.);
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return SampledSpectrum(0.);
        wh = Normalize(wh);
        Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
        return tint * SampledSpectrum(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                      (4 * cosTheta_i * cosTheta_o));

    } else {
        // Compute transmission at non-delta dielectric interface
        Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        // Compute $\wh$ from $\wo$ and $\wi$ for microfacet transmission
        Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
        Vector3f wh = wo + wi * etap;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        if (LengthSquared(wh) == 0)
            return {};
        wh = FaceForward(Normalize(wh), Normal3f(0, 0, 1));

        // Return no transmission if _wi_ and _wo_ are on the same side of _wh_
        if (Dot(wi, wh) * Dot(wo, wh) > 0)
            return {};

        // Evaluate BTDF for transmission through microfacet interface
        Float F = FrDielectric(Dot(wo, wh), eta);
        Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
        Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;
        return tint *
               SampledSpectrum((1 - F) * factor *
                               std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) *
                                        AbsDot(wi, wh) * AbsDot(wo, wh) /
                                        (cosTheta_i * cosTheta_o * Sqr(sqrtDenom))));
    }
}